

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Swap(ExtensionSet *this,ExtensionSet *x)

{
  uint16 uVar1;
  AllocatedData AVar2;
  ExtensionSet extension_set;
  ExtensionSet local_28;
  
  if (this->arena_ == x->arena_) {
    uVar1 = this->flat_capacity_;
    this->flat_capacity_ = x->flat_capacity_;
    x->flat_capacity_ = uVar1;
    uVar1 = this->flat_size_;
    this->flat_size_ = x->flat_size_;
    x->flat_size_ = uVar1;
    AVar2 = this->map_;
    this->map_ = x->map_;
    x->map_ = AVar2;
  }
  else {
    local_28.arena_ = (Arena *)0x0;
    local_28.flat_capacity_ = 0;
    local_28.flat_size_ = 0;
    local_28.map_.flat = (KeyValue *)0x0;
    MergeFrom(&local_28,x);
    Clear(x);
    MergeFrom(x,this);
    Clear(this);
    MergeFrom(this,&local_28);
    ~ExtensionSet(&local_28);
  }
  return;
}

Assistant:

void ExtensionSet::Swap(ExtensionSet* x) {
  if (GetArenaNoVirtual() == x->GetArenaNoVirtual()) {
    using std::swap;
    swap(flat_capacity_, x->flat_capacity_);
    swap(flat_size_, x->flat_size_);
    swap(map_, x->map_);
  } else {
    // TODO(cfallin, rohananil): We maybe able to optimize a case where we are
    // swapping from heap to arena-allocated extension set, by just Own()'ing
    // the extensions.
    ExtensionSet extension_set;
    extension_set.MergeFrom(*x);
    x->Clear();
    x->MergeFrom(*this);
    Clear();
    MergeFrom(extension_set);
  }
}